

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O2

int __thiscall ConditionalEstimator::init(ConditionalEstimator *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  double **ppdVar5;
  int i;
  int extraout_EAX;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  this->bRejection = false;
  (this->super_Estimator).nSamples = 0;
  uVar1 = (this->super_Estimator).nEstimate;
  if ((uVar1 & 4) != 0) {
    iVar2 = this->nPre;
    iVar3 = this->nPost;
    pdVar4 = this->aOne;
    for (lVar8 = 0; lVar8 <= (long)iVar3 + (long)iVar2; lVar8 = lVar8 + 1) {
      pdVar4[lVar8] = 0.0;
    }
  }
  if ((uVar1 & 0x20) != 0) {
    iVar2 = this->nPre;
    iVar3 = this->nPost;
    pdVar4 = this->aEvents;
    for (lVar8 = 0; lVar8 <= (long)iVar3 + (long)iVar2; lVar8 = lVar8 + 1) {
      pdVar4[lVar8] = 0.0;
    }
  }
  if ((uVar1 & 8) != 0) {
    iVar2 = this->nPre;
    iVar3 = this->nPost;
    pdVar4 = this->aTwo;
    for (lVar8 = 0; lVar8 <= (long)iVar3 + (long)iVar2; lVar8 = lVar8 + 1) {
      pdVar4[lVar8] = 0.0;
    }
  }
  if ((uVar1 & 0x10) != 0) {
    iVar2 = this->nPre;
    iVar3 = this->nPost;
    pdVar4 = this->aThree;
    for (lVar8 = 0; lVar8 <= (long)iVar3 + (long)iVar2; lVar8 = lVar8 + 1) {
      pdVar4[lVar8] = 0.0;
    }
  }
  if ((uVar1 & 2) != 0) {
    iVar2 = this->nPre;
    iVar3 = this->nPost;
    uVar7 = 0;
    uVar6 = (ulong)(uint)this->nDist;
    if (this->nDist < 1) {
      uVar6 = uVar7;
    }
    for (; (long)uVar7 <= (long)iVar3 + (long)iVar2; uVar7 = uVar7 + 1) {
      ppdVar5 = this->aDist;
      for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
        ppdVar5[uVar7][uVar9] = 0.0;
      }
    }
  }
  Ring<double>::clear(&this->condSampleRing);
  Ring<bool>::clear(&this->condEventRing);
  return extraout_EAX;
}

Assistant:

void ConditionalEstimator::init()
{
	bRejection = false;
	nSamples = 0;
	if(nEstimate & EST_MEAN)
		for(int i=0; i<nPre+nPost+1; i++)
			aOne[i] = 0.0;
	if(nEstimate & EST_EVENTS)
		for(int i=0; i<nPre+nPost+1; i++)
			aEvents[i] = 0.0;
	if(nEstimate & EST_VAR)
		for(int i=0; i<nPre+nPost+1; i++)
			aTwo[i] = 0.0;
	if(nEstimate & EST_CUR)
		for(int i=0; i<nPre+nPost+1; i++)
			aThree[i] = 0.0;
	if(nEstimate & EST_DENS) {
		for( int i=0; i<nPre+nPost+1; i++ )
			for( int j=0; j<nDist; j++ )
				aDist[i][j] = 0.0;
	}
	condSampleRing.clear();
	condEventRing.clear();
}